

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O2

int __thiscall helics::ConnectorFederateManager::getFilterCount(ConnectorFederateManager *this)

{
  size_t sVar1;
  shared_handle local_20;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::StringMappedVector<std::unique_ptr<helics::Filter,_std::default_delete<helics::Filter>_>,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock_shared(&local_20,&this->filters);
  sVar1 = ((local_20.data)->dataStorage).csize;
  std::shared_lock<std::shared_mutex>::~shared_lock(&local_20.m_handle_lock);
  return (int)sVar1;
}

Assistant:

int ConnectorFederateManager::getFilterCount() const
{
    return static_cast<int>(filters.lock_shared()->size());
}